

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psbt.c
# Opt level: O3

int wally_map_clear(wally_map *map_in)

{
  int iVar1;
  size_t len;
  ulong uVar2;
  long lVar3;
  
  if (map_in == (wally_map *)0x0) {
    iVar1 = -2;
  }
  else {
    iVar1 = 0;
    if (map_in->num_items == 0) {
      len = 0;
    }
    else {
      lVar3 = 0;
      uVar2 = 0;
      do {
        clear_and_free(*(void **)((long)&map_in->items->key + lVar3),
                       *(size_t *)((long)&map_in->items->key_len + lVar3));
        clear_and_free(*(void **)((long)&map_in->items->value + lVar3),
                       *(size_t *)((long)&map_in->items->value_len + lVar3));
        uVar2 = uVar2 + 1;
        lVar3 = lVar3 + 0x20;
      } while (uVar2 < map_in->num_items);
      len = map_in->num_items << 5;
    }
    clear_and_free(map_in->items,len);
    wally_clear(map_in,0x18);
  }
  return iVar1;
}

Assistant:

int wally_map_clear(struct wally_map *map_in)
{
    size_t i;

    if (!map_in)
        return WALLY_EINVAL;
    for (i = 0; i < map_in->num_items; ++i) {
        clear_and_free(map_in->items[i].key, map_in->items[i].key_len);
        clear_and_free(map_in->items[i].value, map_in->items[i].value_len);
    }
    clear_and_free(map_in->items, map_in->num_items * sizeof(*map_in->items));
    wally_clear(map_in, sizeof(*map_in));
    return WALLY_OK;
}